

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateCopyConstructorCode
          (MessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (from.has_$name$()) {\n  $name$_ = new $type$(*from.$name$_);\n} else {\n  $name$_ = NULL;\n}\n"
                    );
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateCopyConstructorCode(io::Printer* printer) const {
  // For non-Arena enabled messages, everything always goes on the heap.
  //
  // For Arena enabled messages, the logic is a bit more convoluted.
  //
  // In the copy constructor, we call InternalMetadataWithArena::MergeFrom,
  // which does *not* copy the Arena pointer.  In the generated MergeFrom
  // (see MessageFieldGenerator::GenerateMergingCode), we:
  // -> copy the has bits (but this is done in bulk by a memcpy in the copy
  //    constructor)
  // -> check whether the destination field pointer is NULL (it will be, since
  //    we're initializing it and would have called SharedCtor) and if so:
  // -> call _slow_mutable_$name$(), which calls either
  //    ::google::protobuf::Arena::CreateMessage<>(GetArenaNoVirtual()), or
  //    ::google::protobuf::Arena::Create<>(GetArenaNoVirtual())
  //
  // At this point, GetArenaNoVirtual returns NULL since the Arena pointer
  // wasn't copied, so both of these methods allocate the submessage on the
  // heap.

  printer->Print(variables_,
    "if (from.has_$name$()) {\n"
    "  $name$_ = new $type$(*from.$name$_);\n"
    "} else {\n"
    "  $name$_ = NULL;\n"
    "}\n");
}